

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O2

void __thiscall
jrtplib::RTCPCompoundPacketBuilder::~RTCPCompoundPacketBuilder(RTCPCompoundPacketBuilder *this)

{
  (this->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPCompoundPacketBuilder_00144868;
  if (this->external == true) {
    (this->super_RTCPCompoundPacket).compoundpacket = (uint8_t *)0x0;
  }
  ClearBuildBuffers(this);
  std::__cxx11::
  _List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::_M_clear(&(this->apppackets).
              super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
            );
  std::__cxx11::
  _List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::_M_clear(&(this->byepackets).
              super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
            );
  SDES::~SDES(&this->sdes);
  Report::~Report(&this->report);
  RTCPCompoundPacket::~RTCPCompoundPacket(&this->super_RTCPCompoundPacket);
  return;
}

Assistant:

RTCPCompoundPacketBuilder::~RTCPCompoundPacketBuilder()
{
	if (external)
		compoundpacket = 0; // make sure RTCPCompoundPacket doesn't delete the external buffer
	ClearBuildBuffers();
}